

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303D::setAccelCTRL2(RTIMUGD20HM303D *this)

{
  uchar ctrl2;
  RTIMUGD20HM303D *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_GD20HM303DAccelLpf < 0) ||
     (3 < ((this->super_RTIMU).m_settings)->m_GD20HM303DAccelLpf)) {
    fprintf(_stderr,"Illegal LSM303D accel low pass fiter code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DAccelLpf);
    this_local._7_1_ = false;
  }
  else {
    switch(((this->super_RTIMU).m_settings)->m_GD20HM303DAccelFsr) {
    case 0:
      this->m_accelScale = 6.1e-05;
      break;
    case 1:
      this->m_accelScale = 0.000122;
      break;
    case 2:
      this->m_accelScale = 0.000183;
      break;
    case 3:
      this->m_accelScale = 0.000244;
      break;
    case 4:
      this->m_accelScale = 0.000732;
      break;
    default:
      fprintf(_stderr,"Illegal LSM303D accel FSR code %d\n",
              (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DAccelFsr);
      return false;
    }
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                            this->m_accelCompassSlaveAddr,'!',
                            (byte)(((this->super_RTIMU).m_settings)->m_GD20HM303DAccelLpf << 6) |
                            (byte)(((this->super_RTIMU).m_settings)->m_GD20HM303DAccelFsr << 3),
                            "Failed to set LSM303D CTRL2");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUGD20HM303D::setAccelCTRL2()
{
    unsigned char ctrl2;

    if ((m_settings->m_GD20HM303DAccelLpf < 0) || (m_settings->m_GD20HM303DAccelLpf > 3)) {
        HAL_ERROR1("Illegal LSM303D accel low pass fiter code %d\n", m_settings->m_GD20HM303DAccelLpf);
        return false;
    }

    switch (m_settings->m_GD20HM303DAccelFsr) {
    case LSM303D_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.000061;
        break;

    case LSM303D_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.000122;
        break;

    case LSM303D_ACCEL_FSR_6:
        m_accelScale = (RTFLOAT)0.000183;
        break;

    case LSM303D_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.000244;
        break;

    case LSM303D_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.000732;
        break;

    default:
        HAL_ERROR1("Illegal LSM303D accel FSR code %d\n", m_settings->m_GD20HM303DAccelFsr);
        return false;
    }

    ctrl2 = (m_settings->m_GD20HM303DAccelLpf << 6) | (m_settings->m_GD20HM303DAccelFsr << 3);

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL2, ctrl2, "Failed to set LSM303D CTRL2");
}